

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void synchronize_regions(bool is_moving_window_iteration)

{
  byte in_DIL;
  int nm2;
  int nm1;
  int in_stack_00000040;
  int in_stack_00000044;
  int in_stack_fffffffffffffff0;
  int nm1_00;
  
  nm1_00 = nm;
  if ((in_DIL & 1) != 0) {
    nm1_00 = nm + 1;
  }
  exchange_fields(nm1_00,in_stack_fffffffffffffff0);
  exchange_particles(in_stack_00000044,in_stack_00000040);
  return;
}

Assistant:

void synchronize_regions(bool is_moving_window_iteration) {
    int nm1, nm2;
    if (is_moving_window_iteration) {
        nm1 = nm-1;
        nm2 = nm+1;
    } else {
        nm1 = nm;
        nm2 = nm;
    }

    exchange_fields(nm1, nm2);
    exchange_particles(nm1, nm2);
}